

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O0

int sptk::snack::xlpc(int lpc_ord,float lpc_stabl,int wsize,float *data,float *lpca,float *ar,
                     float *lpck,float *normerr,float *rms,float preemp,int type,int *nwindp,
                     float **dwindp,int *wsizep,float **windp)

{
  undefined4 *in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  float *in_R8;
  float *in_R9;
  float in_XMM0_Da;
  double dVar1;
  double dVar2;
  float *in_stack_00000008;
  float *in_stack_00000010;
  float ffact;
  int i;
  float wfact;
  float er;
  float en;
  float *ap;
  float *kp;
  float *r;
  float a [101];
  float k [100];
  float rho [101];
  int nwind;
  float *dwind;
  size_t in_stack_fffffffffffffab8;
  float **in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad0;
  int iVar3;
  float type_00;
  float in_stack_fffffffffffffad8;
  float in_stack_fffffffffffffadc;
  float *in_stack_fffffffffffffae0;
  undefined4 *puVar4;
  float *in_stack_fffffffffffffae8;
  float *pfVar5;
  undefined4 local_508 [58];
  float *in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbec;
  float *in_stack_fffffffffffffbf0;
  float *in_stack_fffffffffffffbf8;
  float *in_stack_fffffffffffffc00;
  float local_368 [100];
  float local_1d8 [101];
  int local_44;
  void *local_40;
  float *local_30;
  float *local_28;
  undefined4 *local_20;
  int local_10;
  float local_c;
  int local_8;
  int local_4;
  
  local_40 = *(void **)ap;
  local_44 = *_er;
  type_00 = 1.0;
  if (((in_ESI < 1) || (in_RDX == 0)) || (100 < in_EDI)) {
    local_4 = 0;
  }
  else {
    local_30 = in_R9;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_c = in_XMM0_Da;
    local_8 = in_EDI;
    if (local_44 != in_ESI) {
      local_10 = in_ESI;
      if (local_40 == (void *)0x0) {
        local_40 = ckalloc(0x13d932);
      }
      else {
        local_40 = ckrealloc(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      }
      if (local_40 == (void *)0x0) {
        fprintf(_stderr,"Can\'t allocate scratch memory in lpc()\n");
        return 0;
      }
      local_44 = local_10;
      *_er = local_10;
      *(void **)ap = local_40;
    }
    window(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,(int)in_stack_fffffffffffffadc,
           in_stack_fffffffffffffad8,(int)type_00,
           (int *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
           in_stack_fffffffffffffac0);
    pfVar5 = local_28;
    if (local_28 == (float *)0x0) {
      pfVar5 = local_1d8;
    }
    if (local_30 == (float *)0x0) {
      local_30 = local_368;
    }
    puVar4 = local_20;
    if (local_20 == (undefined4 *)0x0) {
      puVar4 = local_508;
    }
    xautoc((int)((ulong)pfVar5 >> 0x20),local_30,(int)((ulong)puVar4 >> 0x20),
           (float *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
           (float *)CONCAT44(type_00,in_stack_fffffffffffffad0));
    if (1.0 < local_c) {
      dVar1 = (double)-local_c / 20.0;
      dVar2 = log(10.0);
      dVar1 = exp(dVar1 * dVar2);
      for (iVar3 = 1; iVar3 <= local_8; iVar3 = iVar3 + 1) {
        local_1d8[iVar3] = (float)(1.0 / (dVar1 + 1.0)) * pfVar5[iVar3];
      }
      local_1d8[0] = *pfVar5;
      if (local_28 != (float *)0x0) {
        for (iVar3 = 0; iVar3 <= local_8; iVar3 = iVar3 + 1) {
          local_28[iVar3] = local_1d8[iVar3];
        }
      }
    }
    xdurbin(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
            in_stack_fffffffffffffbec,in_stack_fffffffffffffbe0);
    switch(i) {
    case 0:
      type_00 = 1.0;
      break;
    case 1:
      type_00 = 0.630397;
      break;
    case 2:
      type_00 = 0.443149;
      break;
    case 3:
      type_00 = 0.612372;
    }
    *puVar4 = 0x3f800000;
    if (in_stack_00000010 != (float *)0x0) {
      *in_stack_00000010 = in_stack_fffffffffffffadc / type_00;
    }
    if (in_stack_00000008 != (float *)0x0) {
      *in_stack_00000008 = in_stack_fffffffffffffad8;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int xlpc(int lpc_ord, float lpc_stabl, int wsize, float *data, float *lpca,
         float *ar, float *lpck, float *normerr, float *rms, float preemp,
         int type, int *nwindp, float **dwindp, int *wsizep, float **windp)
#endif
{
#if 0
  static float *dwind=NULL;
  static int nwind=0;
#else
  float *dwind=*dwindp;
  int nwind=*nwindp;
#endif
  float rho[BIGSORD+1], k[BIGSORD], a[BIGSORD+1],*r,*kp,*ap,en,er,wfact=1.0;

  if((wsize <= 0) || (!data) || (lpc_ord > BIGSORD)) return(FALSE);
  
  if(nwind != wsize) {
    if(dwind) dwind = (float*)ckrealloc((void *)dwind,wsize*sizeof(float));
    else dwind = (float*)ckalloc(wsize*sizeof(float));
    if(!dwind) {
      Fprintf(stderr,"Can't allocate scratch memory in lpc()\n");
      return(FALSE);
    }
    nwind = wsize;
#if 1
    *nwindp = nwind;
    *dwindp = dwind;
#endif
  }
  
#if 0
  window(data, dwind, wsize, preemp, type);
#else
  window(data, dwind, wsize, preemp, type, wsizep, windp);
#endif
  if(!(r = ar)) r = rho;	/* Permit optional return of the various */
  if(!(kp = lpck)) kp = k;	/* coefficients and intermediate results. */
  if(!(ap = lpca)) ap = a;
  xautoc( wsize, dwind, lpc_ord, r, &en );
  if(lpc_stabl > 1.0) {	/* add a little to the diagonal for stability */
    int i;
    float ffact;
    ffact = (float) (1.0/(1.0 + exp((-lpc_stabl/20.0) * log(10.0))));
    for(i=1; i <= lpc_ord; i++) rho[i] = ffact * r[i];
    *rho = *r;
    r = rho;
    if(ar)
      for(i=0;i<=lpc_ord; i++) ar[i] = r[i];
  }
  xdurbin ( r, kp, &ap[1], lpc_ord, &er);
  switch(type) {		/* rms correction for window */
  case 0:
    wfact = 1.0;		/* rectangular */
    break;
  case 1:
    wfact = .630397f;		/* Hamming */
    break;
  case 2:
    wfact = .443149f;		/* (.5 - .5*cos)^4 */
    break;
  case 3:
    wfact = .612372f;		/* Hanning */
    break;
  }
  *ap = 1.0;
  if(rms) *rms = en/wfact;
  if(normerr) *normerr = er;
  return(TRUE);
}